

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * mac2string_abi_cxx11_(uint64_t mac)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  undefined8 uVar3;
  ostream *poVar4;
  ulong in_RSI;
  string *in_RDI;
  ostringstream out;
  ostringstream local_188 [376];
  ulong local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  uVar3 = std::ostream::operator<<(local_188,std::hex);
  _Var1 = std::setfill<char>('0');
  std::operator<<(uVar3,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar4 = std::operator<<((ostream *)local_188,_Var2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10 >> 0x28 & 0xff);
  poVar4 = std::operator<<(poVar4,':');
  _Var2 = std::setw(2);
  poVar4 = std::operator<<(poVar4,_Var2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10 >> 0x20 & 0xff);
  poVar4 = std::operator<<(poVar4,':');
  _Var2 = std::setw(2);
  poVar4 = std::operator<<(poVar4,_Var2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10 >> 0x18 & 0xff);
  poVar4 = std::operator<<(poVar4,':');
  _Var2 = std::setw(2);
  poVar4 = std::operator<<(poVar4,_Var2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10 >> 0x10 & 0xff);
  poVar4 = std::operator<<(poVar4,':');
  _Var2 = std::setw(2);
  poVar4 = std::operator<<(poVar4,_Var2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10 >> 8 & 0xff);
  poVar4 = std::operator<<(poVar4,':');
  _Var2 = std::setw(2);
  poVar4 = std::operator<<(poVar4,_Var2);
  std::ostream::operator<<(poVar4,(ulong)(byte)local_10);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

inline std::string mac2string(const uint64_t mac)
{
  std::ostringstream out;

  out << std::hex << std::setfill('0');
  out << std::setw(2) << ((mac>>40)&0xff) << ':' << std::setw(2) << ((mac>>32)&0xff) << ':'
      << std::setw(2) << ((mac>>24)&0xff) << ':' << std::setw(2) << ((mac>>16)&0xff) << ':'
      << std::setw(2) << ((mac>>8)&0xff) << ':' << std::setw(2) << (mac&0xff);

  return out.str();
}